

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

int maintain_version(char *file,int forcep)

{
  FileName *pFVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  char *local_3190;
  char *lf_cp2_3;
  char *lf_cp1_3;
  char *lf_cp2_2;
  char *lf_cp1_2;
  char *lf_cp2_1;
  char *lf_cp1_1;
  char *lf_cp2;
  char *lf_cp1;
  FileName *entry;
  int max_no;
  int rval;
  int highest_p;
  char vless [4096];
  char old_file [4096];
  char ver [16];
  char fname [255];
  char dir [4096];
  int forcep_local;
  char *file_local;
  
  iVar2 = unpack_filename(file,fname + 0xf8,ver + 8,old_file + 0xff8,1);
  if (iVar2 == 0) {
    file_local._4_4_ = 0;
  }
  else {
    iVar2 = true_name(fname + 0xf8);
    if (iVar2 == -1) {
      iVar2 = get_version_array(fname + 0xf8,ver + 8);
      if (iVar2 == 0) {
        file_local._4_4_ = 0;
      }
      else if ((VA.files)->version_no == 0xffffffff) {
        file_local._4_4_ = 1;
      }
      else if (((VA.files)->version_no == 0) && (VA.files[1].version_no == 0xffffffff)) {
        if (forcep != 0) {
          get_versionless(VA.files,(char *)&rval,fname + 0xf8);
          strcpy(ver + 8,(char *)&rval);
          strcat(ver + 8,".~");
          strcat(ver + 8,"1");
          strcat(ver + 8,"~");
          alarm(TIMEOUT_TIME);
          do {
            piVar3 = __errno_location();
            *piVar3 = 0;
            iVar2 = link((char *)&rval,ver + 8);
            bVar4 = false;
            if (iVar2 == -1) {
              piVar3 = __errno_location();
              bVar4 = *piVar3 == 4;
            }
          } while (bVar4);
          alarm(0);
          if (iVar2 == -1) {
            piVar3 = __errno_location();
            *Lisp_errno = *piVar3;
            return 0;
          }
        }
        file_local._4_4_ = 1;
      }
      else {
        iVar2 = get_versionless(VA.files,(char *)&rval,fname + 0xf8);
        pFVar1 = VA.files;
        if (iVar2 == 0) {
          lf_cp2 = fname + 0xf8;
          for (lf_cp1_1 = fname + 0xf8; *lf_cp1_1 != '\0'; lf_cp1_1 = lf_cp1_1 + 1) {
            if (*lf_cp1_1 == '/') {
              lf_cp2 = lf_cp1_1;
            }
          }
          if (lf_cp2 == lf_cp1_1 + -1) {
            if (lf_cp2 == fname + 0xf8) {
              strcpy(vless + 0xff8,"/");
              strcat(vless + 0xff8,pFVar1->name);
            }
            else {
              strcpy(vless + 0xff8,fname + 0xf8);
              strcat(vless + 0xff8,pFVar1->name);
            }
          }
          else {
            strcpy(vless + 0xff8,fname + 0xf8);
            strcat(vless + 0xff8,"/");
            strcat(vless + 0xff8,pFVar1->name);
          }
          strcpy(ver + 8,pFVar1->name);
          separate_version(ver + 8,old_file + 0xff8,1);
          lf_cp2_1 = fname + 0xf8;
          for (lf_cp1_2 = fname + 0xf8; *lf_cp1_2 != '\0'; lf_cp1_2 = lf_cp1_2 + 1) {
            if (*lf_cp1_2 == '/') {
              lf_cp2_1 = lf_cp1_2;
            }
          }
          if (lf_cp2_1 == lf_cp1_2 + -1) {
            if (lf_cp2_1 == fname + 0xf8) {
              strcpy((char *)&rval,"/");
              strcat((char *)&rval,ver + 8);
            }
            else {
              strcpy((char *)&rval,fname + 0xf8);
              strcat((char *)&rval,ver + 8);
            }
          }
          else {
            strcpy((char *)&rval,fname + 0xf8);
            strcat((char *)&rval,"/");
            strcat((char *)&rval,ver + 8);
          }
          alarm(TIMEOUT_TIME);
          do {
            piVar3 = __errno_location();
            *piVar3 = 0;
            iVar2 = link(vless + 0xff8,(char *)&rval);
            bVar4 = false;
            if (iVar2 == -1) {
              piVar3 = __errno_location();
              bVar4 = *piVar3 == 4;
            }
          } while (bVar4);
          alarm(0);
          if (iVar2 == -1) {
            piVar3 = __errno_location();
            *Lisp_errno = *piVar3;
            file_local._4_4_ = 0;
          }
          else {
            file_local._4_4_ = 1;
          }
        }
        else {
          iVar2 = check_vless_link((char *)&rval,VA.files,vless + 0xff8,&max_no);
          if (iVar2 == 0) {
            file_local._4_4_ = 0;
          }
          else if (vless[0xff8] == '\0') {
            sprintf(old_file + 0xff8,"%u",(ulong)((VA.files)->version_no + 1));
            if (old_file[0xff8] == '\0') {
              strcpy(vless + 0xff8,(char *)&rval);
            }
            else {
              strcpy(vless + 0xff8,(char *)&rval);
              strcat(vless + 0xff8,".~");
              strcat(vless + 0xff8,old_file + 0xff8);
              strcat(vless + 0xff8,"~");
            }
            alarm(TIMEOUT_TIME);
            do {
              piVar3 = __errno_location();
              *piVar3 = 0;
              iVar2 = link((char *)&rval,vless + 0xff8);
              bVar4 = false;
              if (iVar2 == -1) {
                piVar3 = __errno_location();
                bVar4 = *piVar3 == 4;
              }
            } while (bVar4);
            alarm(0);
            if (iVar2 == -1) {
              piVar3 = __errno_location();
              *Lisp_errno = *piVar3;
              file_local._4_4_ = 0;
            }
            else {
              file_local._4_4_ = 1;
            }
          }
          else if (max_no == 0) {
            alarm(TIMEOUT_TIME);
            do {
              piVar3 = __errno_location();
              *piVar3 = 0;
              iVar2 = unlink((char *)&rval);
              bVar4 = false;
              if (iVar2 == -1) {
                piVar3 = __errno_location();
                bVar4 = *piVar3 == 4;
              }
            } while (bVar4);
            alarm(0);
            pFVar1 = VA.files;
            if (iVar2 == -1) {
              piVar3 = __errno_location();
              *Lisp_errno = *piVar3;
              file_local._4_4_ = 0;
            }
            else {
              lf_cp2_2 = fname + 0xf8;
              for (lf_cp1_3 = fname + 0xf8; *lf_cp1_3 != '\0'; lf_cp1_3 = lf_cp1_3 + 1) {
                if (*lf_cp1_3 == '/') {
                  lf_cp2_2 = lf_cp1_3;
                }
              }
              if (lf_cp2_2 == lf_cp1_3 + -1) {
                if (lf_cp2_2 == fname + 0xf8) {
                  strcpy(vless + 0xff8,"/");
                  strcat(vless + 0xff8,pFVar1->name);
                }
                else {
                  strcpy(vless + 0xff8,fname + 0xf8);
                  strcat(vless + 0xff8,pFVar1->name);
                }
              }
              else {
                strcpy(vless + 0xff8,fname + 0xf8);
                strcat(vless + 0xff8,"/");
                strcat(vless + 0xff8,pFVar1->name);
              }
              strcpy(ver + 8,pFVar1->name);
              separate_version(ver + 8,old_file + 0xff8,1);
              lf_cp2_3 = fname + 0xf8;
              for (local_3190 = fname + 0xf8; *local_3190 != '\0'; local_3190 = local_3190 + 1) {
                if (*local_3190 == '/') {
                  lf_cp2_3 = local_3190;
                }
              }
              if (lf_cp2_3 == local_3190 + -1) {
                if (lf_cp2_3 == fname + 0xf8) {
                  strcpy((char *)&rval,"/");
                  strcat((char *)&rval,ver + 8);
                }
                else {
                  strcpy((char *)&rval,fname + 0xf8);
                  strcat((char *)&rval,ver + 8);
                }
              }
              else {
                strcpy((char *)&rval,fname + 0xf8);
                strcat((char *)&rval,"/");
                strcat((char *)&rval,ver + 8);
              }
              alarm(TIMEOUT_TIME);
              do {
                piVar3 = __errno_location();
                *piVar3 = 0;
                iVar2 = link(vless + 0xff8,(char *)&rval);
                bVar4 = false;
                if (iVar2 == -1) {
                  piVar3 = __errno_location();
                  bVar4 = *piVar3 == 4;
                }
              } while (bVar4);
              alarm(0);
              if (iVar2 == -1) {
                piVar3 = __errno_location();
                *Lisp_errno = *piVar3;
                file_local._4_4_ = 0;
              }
              else {
                file_local._4_4_ = 1;
              }
            }
          }
          else {
            file_local._4_4_ = 1;
          }
        }
      }
    }
    else {
      file_local._4_4_ = 0;
    }
  }
  return file_local._4_4_;
}

Assistant:

static int maintain_version(char *file, int forcep)
{
  char dir[MAXPATHLEN], fname[MAXNAMLEN], ver[VERSIONLEN];
  char old_file[MAXPATHLEN], vless[MAXPATHLEN];
  int highest_p;
  int rval, max_no;
  FileName *entry;

  if (unpack_filename(file, dir, fname, ver, 1) == 0) return (0);
  /*
   * We have to make sure that dir is the existing directory.
   */
  if (true_name(dir) != -1) return (0);
  if (get_version_array(dir, fname) == 0) return (0);

  if (NoFileP(VA.files)) {
    /*
     * We don't need to care about such case that there is no such file
     * or an only versionless file exists.
     */
    return (1);
  }

  if (OnlyVersionlessP(VA.files)) {
    if (forcep) {
/*
 * If forcep, we link the versionless file to the version
 * 1 file.
 */
#ifndef DOS
      get_versionless(VA.files, vless, dir);
      ConcNameAndVersion(vless, "1", fname);
      TIMEOUT(rval = link(vless, fname));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (0);
      }
#endif /* DOS */
    }
    return (1);
  }

  /*
   * At this point, we are sure that at least one file with version number
   * exists.  Thus, FindHighestVersion works fine from now on.
   */

  if (get_versionless(VA.files, vless, dir) == 0) {
    /*
     * There is not a versionless file, but at least one versioned file.
     * Thus, the thing we have to do is to link a versionless file
     * to the existing highest versioned file.
     */
    FindHighestVersion(VA.files, entry, max_no);
    ConcDirAndName(dir, entry->name, old_file);
/*
 * The versionless file should have the same case name as the old
 * file.
 */
#ifndef DOS
    strcpy(fname, entry->name);
    separate_version(fname, ver, 1);
    ConcDirAndName(dir, fname, vless);
    TIMEOUT(rval = link(old_file, vless));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (0);
    }
#endif /* DOS */
    return (1);
  }

  if (check_vless_link(vless, VA.files, old_file, &highest_p) == 0) return (0);

  if (*old_file == '\0') {
    /*
     * The versionless file is not linked to any file in VA.files.
     * Thus, we have to link the versionless file to the file which
     * is versioned one higher than the existing highest version.
     */
    FindHighestVersion(VA.files, entry, max_no);
    sprintf(ver, "%u", max_no + 1);
/*
 * The old file should have the same case name as the versionless
 * file.
 */
#ifndef DOS
    ConcNameAndVersion(vless, ver, old_file);
    TIMEOUT(rval = link(vless, old_file));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (0);
    }
#endif /* DOS */
    return (1);
  }

  if (highest_p) {
    /*
     * The versionless file has been already linked to the highest
     * versioned file.  Thus, there is nothing to do.
     */
    return (1);
  } else {
    /*
     * Although the  versionless file is linked to a file in VA.files,
     * the file is not the highest versioned file.  We have to unlink
     * the wrongly linked versionless file, and link the highest versioned
     * file to a versionless file.
     */
    TIMEOUT(rval = unlink(vless));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (0);
    }
    FindHighestVersion(VA.files, entry, max_no);
    ConcDirAndName(dir, entry->name, old_file);
/*
 * The versionless file should have the same case name as the old
 * file.
 */
#ifndef DOS
    strcpy(fname, entry->name);
    separate_version(fname, ver, 1);
    ConcDirAndName(dir, fname, vless);
    TIMEOUT(rval = link(old_file, vless));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (0);
    }
#endif /* DOS */
    return (1);
  }
}